

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O0

void Nwk_ManDelayTraceSortPins(Nwk_Obj_t *pNode,int *pPinPerm,float *pPinDelays)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  float fVar4;
  int local_34;
  int temp;
  int best_i;
  int j;
  int i;
  Nwk_Obj_t *pFanin;
  float *pPinDelays_local;
  int *pPinPerm_local;
  Nwk_Obj_t *pNode_local;
  
  best_i = 0;
  while( true ) {
    bVar3 = false;
    if (best_i < pNode->nFanins) {
      _j = pNode->pFanio[best_i];
      bVar3 = _j != (Nwk_Obj_t *)0x0;
    }
    if (!bVar3) break;
    pPinPerm[best_i] = best_i;
    fVar4 = Nwk_ObjArrival(_j);
    pPinDelays[best_i] = fVar4;
    best_i = best_i + 1;
  }
  for (best_i = 0; iVar1 = Nwk_ObjFaninNum(pNode), best_i < iVar1 + -1; best_i = best_i + 1) {
    local_34 = best_i;
    temp = best_i;
    while( true ) {
      temp = temp + 1;
      iVar1 = Nwk_ObjFaninNum(pNode);
      if (iVar1 <= temp) break;
      if (pPinDelays[pPinPerm[local_34]] <= pPinDelays[pPinPerm[temp]] &&
          pPinDelays[pPinPerm[temp]] != pPinDelays[pPinPerm[local_34]]) {
        local_34 = temp;
      }
    }
    if (local_34 != best_i) {
      iVar1 = pPinPerm[best_i];
      pPinPerm[best_i] = pPinPerm[local_34];
      pPinPerm[local_34] = iVar1;
    }
  }
  iVar1 = Nwk_ObjFaninNum(pNode);
  if ((iVar1 != 0) && (iVar1 = *pPinPerm, iVar2 = Nwk_ObjFaninNum(pNode), iVar2 <= iVar1)) {
    __assert_fail("Nwk_ObjFaninNum(pNode) == 0 || pPinPerm[0] < Nwk_ObjFaninNum(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkTiming.c"
                  ,0x5c,"void Nwk_ManDelayTraceSortPins(Nwk_Obj_t *, int *, float *)");
  }
  best_i = 1;
  while( true ) {
    iVar1 = Nwk_ObjFaninNum(pNode);
    if (iVar1 <= best_i) {
      return;
    }
    iVar1 = pPinPerm[best_i];
    iVar2 = Nwk_ObjFaninNum(pNode);
    if (iVar2 <= iVar1) break;
    if (pPinDelays[pPinPerm[best_i + -1]] < pPinDelays[pPinPerm[best_i]]) {
      __assert_fail("pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkTiming.c"
                    ,0x60,"void Nwk_ManDelayTraceSortPins(Nwk_Obj_t *, int *, float *)");
    }
    best_i = best_i + 1;
  }
  __assert_fail("pPinPerm[i] < Nwk_ObjFaninNum(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkTiming.c"
                ,0x5f,"void Nwk_ManDelayTraceSortPins(Nwk_Obj_t *, int *, float *)");
}

Assistant:

void Nwk_ManDelayTraceSortPins( Nwk_Obj_t * pNode, int * pPinPerm, float * pPinDelays )
{
    Nwk_Obj_t * pFanin;
    int i, j, best_i, temp;
    // start the trivial permutation and collect pin delays
    Nwk_ObjForEachFanin( pNode, pFanin, i )
    {
        pPinPerm[i] = i;
        pPinDelays[i] = Nwk_ObjArrival(pFanin);
    }
    // selection sort the pins in the decreasible order of delays
    // this order will match the increasing order of LUT input pins
    for ( i = 0; i < Nwk_ObjFaninNum(pNode)-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < Nwk_ObjFaninNum(pNode); j++ )
            if ( pPinDelays[pPinPerm[j]] > pPinDelays[pPinPerm[best_i]] )
                best_i = j;
        if ( best_i == i )
            continue;
        temp = pPinPerm[i]; 
        pPinPerm[i] = pPinPerm[best_i]; 
        pPinPerm[best_i] = temp;
    }
    // verify
    assert( Nwk_ObjFaninNum(pNode) == 0 || pPinPerm[0] < Nwk_ObjFaninNum(pNode) );
    for ( i = 1; i < Nwk_ObjFaninNum(pNode); i++ )
    {
        assert( pPinPerm[i] < Nwk_ObjFaninNum(pNode) );
        assert( pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]] );
    }
}